

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::upper_bound(base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
              *this,key_type *key)

{
  iterator checker_iter;
  iterator iVar1;
  iterator iVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  bVar2;
  
  iVar1 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::upper_bound<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  checker_iter = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::upper_bound(&(this->checker_)._M_t,key);
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                *)SUB128(iVar1._0_12_,0);
  bVar2.position = SUB124(iVar1._0_12_,8);
  bVar2 = base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>,std::_Rb_tree_const_iterator<std::pair<int,int>>>
                    ((base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
                      *)this,bVar2,
                     (_Rb_tree_const_iterator<std::pair<int,_int>_>)checker_iter._M_node);
  iVar3.node = bVar2.node;
  iVar3.position = bVar2.position;
  iVar3._12_4_ = bVar2._12_4_;
  return iVar3;
}

Assistant:

iterator upper_bound(const key_type &key) {
        return iter_check(tree_.upper_bound(key), checker_.upper_bound(key));
    }